

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::GetEnv(VirtualMachine *this)

{
  char *pcVar1;
  element_type *peVar2;
  char *__s;
  anon_union_8_6_52c89740_for_Variable_1 aVar3;
  undefined8 uVar4;
  Variable VVar5;
  
  VVar5 = popOpStack(this);
  if (VVar5.type == String) {
    __s = getenv((char *)((VVar5.field_1.objectValue)->properties)._M_h._M_buckets);
    if (__s != (char *)0x0) {
      aVar3.stringValue = Heap::NewString_abi_cxx11_(&this->heap);
      ((aVar3.objectValue)->properties)._M_h._M_bucket_count = 0;
      *(char *)((aVar3.objectValue)->properties)._M_h._M_buckets = '\0';
      pcVar1 = (char *)((aVar3.objectValue)->properties)._M_h._M_bucket_count;
      strlen(__s);
      std::__cxx11::string::_M_replace(aVar3.integerValue,0,pcVar1,(ulong)__s);
      uVar4 = 4;
      goto LAB_00117ab7;
    }
  }
  uVar4 = 0;
  aVar3.integerValue = 0;
LAB_00117ab7:
  VVar5.field_1.integerValue = aVar3.integerValue;
  VVar5._0_8_ = uVar4;
  pushOpStack(this,VVar5);
  peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2->programCounter = peVar2->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::GetEnv() {
  Variable first = this->popOpStack();

  if (first.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  auto getEnvVal = std::getenv(first.stringValue->c_str());

  if (getEnvVal == nullptr) {
    this->pushUndefined();

  } else {
    std::string* newString = this->heap.NewString();
    newString->clear();
    newString->assign(getEnvVal);
    this->pushString(newString);
  }

  this->advance();
}